

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSNode.h
# Opt level: O1

bool __thiscall dg::pta::PSNodeRet::addReturnSite(PSNodeRet *this,PSNode *r)

{
  pointer *pppPVar1;
  iterator __position;
  PSNode *pPVar2;
  PSNode **ppPVar3;
  bool bVar4;
  PSNode *local_10;
  
  ppPVar3 = (this->returns).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __position._M_current =
       (this->returns).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  bVar4 = ppPVar3 == __position._M_current;
  if (!bVar4) {
    pPVar2 = *ppPVar3;
    while (pPVar2 != r) {
      ppPVar3 = ppPVar3 + 1;
      bVar4 = ppPVar3 == __position._M_current;
      if (bVar4) goto LAB_0011cd3e;
      pPVar2 = *ppPVar3;
    }
    if (bVar4 == false) {
      return false;
    }
  }
LAB_0011cd3e:
  if (__position._M_current ==
      (this->returns).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10 = r;
    std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
    _M_realloc_insert<dg::pta::PSNode*const&>
              ((vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&this->returns,
               __position,&local_10);
  }
  else {
    *__position._M_current = r;
    pppPVar1 = &(this->returns).
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
  }
  return bVar4;
}

Assistant:

bool addReturnSite(PSNode *r) {
        // we suppose there are just few callees,
        // so this should be faster than std::set
        for (PSNode *p : returns) {
            if (p == r)
                return false;
        }

        returns.push_back(r);
        return true;
    }